

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
MonahanBGPlanner::BackupStageSlow
          (QFunctionsDiscrete *__return_storage_ptr__,MonahanBGPlanner *this,QFunctionsDiscrete *Qs)

{
  int iVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  GaoVectorSetIndex a;
  size_type sVar3;
  GaobetaVectorSet G;
  GaobetaVectorSet GStack_c8;
  
  pPVar2 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar2 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  iVar1 = (**(code **)((long)*(pPVar2->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar1,(allocator_type *)&GStack_c8);
  BackProjectMonahanBG(&GStack_c8,this,Qs);
  for (sVar3 = 0; (long)iVar1 != sVar3; sVar3 = sVar3 + 1) {
    MonahanCrossSum(this,&GStack_c8,__return_storage_ptr__,(Index)sVar3,
                    (this->super_MonahanPlanner)._m_doIncPrune,0);
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&GStack_c8);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
MonahanBGPlanner::BackupStageSlow(const QFunctionsDiscrete &Qs)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Qs1(nrA);

    GaobetaVectorSet G=BackProjectMonahanBG(Qs);

    // Do the cross-sums, results are stored in V1
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
        MonahanCrossSum(G,Qs1,a,_m_doIncPrune);

    return(Qs1);
}